

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  bool _aborting;
  GroupInfo GStack_d8;
  TestGroupStats local_a8;
  
  pIVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&GStack_d8,(string *)testSpec);
  GStack_d8.groupIndex = groupIndex;
  GStack_d8.groupsCounts = groupsCount;
  _aborting = aborting(this);
  TestGroupStats::TestGroupStats(&local_a8,&GStack_d8,totals,_aborting);
  (*pIVar1->_vptr_IStreamingReporter[0xe])(pIVar1,&local_a8);
  TestGroupStats::~TestGroupStats(&local_a8);
  std::__cxx11::string::~string((string *)&GStack_d8);
  return;
}

Assistant:

void RunContext::testGroupEnded(std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount) {
        m_reporter->testGroupEnded(TestGroupStats(GroupInfo(testSpec, groupIndex, groupsCount), totals, aborting()));
    }